

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polish.c
# Opt level: O2

c_int polish(OSQPWorkspace *work)

{
  c_int *pcVar1;
  double dVar2;
  c_int *pcVar3;
  csc *pcVar4;
  c_int *pcVar5;
  OSQPInfo *pOVar6;
  double dVar7;
  double dVar8;
  csc *pcVar9;
  OSQPData *pOVar10;
  c_int cVar11;
  c_float *a;
  long lVar12;
  c_float *a_00;
  c_float *b;
  OSQPPolish *pOVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  c_float cVar18;
  LinSysSolver *plsh;
  c_int local_40;
  LinSysSolver *local_38;
  
  osqp_tic(work->timer);
  pOVar13 = work->pol;
  pOVar13->n_low = 0;
  pOVar13->n_upp = 0;
  pOVar10 = work->data;
  for (lVar14 = 0; lVar17 = pOVar10->m, lVar14 < lVar17; lVar14 = lVar14 + 1) {
    lVar17 = -1;
    if (work->z[lVar14] - pOVar10->l[lVar14] < -work->y[lVar14]) {
      pOVar13->Alow_to_A[pOVar13->n_low] = lVar14;
      lVar17 = pOVar13->n_low;
      pOVar13->n_low = lVar17 + 1;
    }
    pOVar13->A_to_Alow[lVar14] = lVar17;
  }
  for (lVar14 = 0; lVar14 < lVar17; lVar14 = lVar14 + 1) {
    lVar17 = -1;
    if (pOVar10->u[lVar14] - work->z[lVar14] < work->y[lVar14]) {
      pOVar13->Aupp_to_A[pOVar13->n_upp] = lVar14;
      lVar17 = pOVar13->n_upp;
      pOVar13->n_upp = lVar17 + 1;
    }
    pOVar13->A_to_Aupp[lVar14] = lVar17;
    lVar17 = pOVar10->m;
  }
  lVar14 = pOVar13->n_upp + pOVar13->n_low;
  if (lVar14 == 0) {
    pcVar9 = csc_spalloc(0,pOVar10->n,0,1,0);
    work->pol->Ared = pcVar9;
    if (pcVar9 == (csc *)0x0) goto LAB_00106d36;
    lVar14 = 0;
    int_vec_set_scalar(pcVar9->p,0,work->data->n + 1);
    pOVar10 = work->data;
    pcVar9 = work->pol->Ared;
  }
  else {
    pcVar9 = pOVar10->A;
    lVar16 = 0;
    lVar17 = pcVar9->p[pcVar9->n];
    if (pcVar9->p[pcVar9->n] < 1) {
      lVar17 = lVar16;
    }
    cVar11 = 0;
    for (; lVar17 != lVar16; lVar16 = lVar16 + 1) {
      if ((pOVar13->A_to_Alow[pcVar9->i[lVar16]] != -1) ||
         (pOVar13->A_to_Aupp[pcVar9->i[lVar16]] != -1)) {
        cVar11 = cVar11 + 1;
      }
    }
    pcVar9 = csc_spalloc(lVar14,pOVar10->n,cVar11,1,0);
    pOVar13 = work->pol;
    pOVar13->Ared = pcVar9;
    if (pcVar9 == (csc *)0x0) {
LAB_00106d36:
      work->info->status_polish = -1;
      return -1;
    }
    pOVar10 = work->data;
    pcVar3 = pcVar9->p;
    lVar14 = 0;
    lVar17 = 0;
    while (lVar14 < pOVar10->n) {
      pcVar3[lVar14] = lVar17;
      pcVar4 = pOVar10->A;
      pcVar5 = pcVar4->p;
      pcVar1 = pcVar5 + lVar14;
      lVar14 = lVar14 + 1;
      for (cVar11 = *pcVar1; cVar11 < pcVar5[lVar14]; cVar11 = cVar11 + 1) {
        lVar16 = pOVar13->A_to_Alow[pcVar4->i[cVar11]];
        if (lVar16 == -1) {
          if (pOVar13->A_to_Aupp[pcVar4->i[cVar11]] != -1) {
            lVar16 = pOVar13->A_to_Aupp[pcVar4->i[cVar11]] + pOVar13->n_low;
            goto LAB_00106cb9;
          }
        }
        else {
LAB_00106cb9:
          pcVar9->i[lVar17] = lVar16;
          pcVar9->x[lVar17] = pcVar4->x[cVar11];
          lVar17 = lVar17 + 1;
        }
      }
    }
    pcVar3[pOVar10->n] = lVar17;
    lVar14 = pOVar13->n_upp + pOVar13->n_low;
    if (lVar14 < 0) goto LAB_00106d36;
  }
  cVar11 = init_linsys_solver(&plsh,pOVar10->P,pcVar9,work->settings->delta,(c_float *)0x0,
                              work->settings->linsys_solver,1);
  if (cVar11 != 0) {
    work->info->status_polish = -1;
    pcVar9 = work->pol->Ared;
    if (pcVar9 != (csc *)0x0) {
      csc_spfree(pcVar9);
      return 1;
    }
    return 1;
  }
  pOVar10 = work->data;
  lVar17 = pOVar10->n;
  a = (c_float *)malloc((lVar14 + lVar17) * 8);
  if (a == (c_float *)0x0) {
    work->info->status_polish = -1;
    csc_spfree(work->pol->Ared);
    return -1;
  }
  lVar12 = 0;
  lVar16 = 0;
  if (0 < lVar17) {
    lVar16 = lVar17;
  }
  for (; lVar16 != lVar12; lVar12 = lVar12 + 1) {
    a[lVar12] = -pOVar10->q[lVar12];
  }
  pOVar13 = work->pol;
  lVar16 = pOVar13->n_low;
  lVar15 = 0;
  lVar12 = 0;
  if (0 < lVar16) {
    lVar12 = lVar16;
  }
  for (; lVar12 != lVar15; lVar15 = lVar15 + 1) {
    a[lVar17 + lVar15] = pOVar10->l[pOVar13->Alow_to_A[lVar15]];
  }
  lVar15 = 0;
  lVar12 = pOVar13->n_upp;
  if (pOVar13->n_upp < 1) {
    lVar12 = lVar15;
  }
  for (; lVar12 != lVar15; lVar15 = lVar15 + 1) {
    a[lVar17 + lVar16 + lVar15] = pOVar10->u[pOVar13->Aupp_to_A[lVar15]];
  }
  a_00 = vec_copy(a,lVar14 + lVar17);
  if (a_00 == (c_float *)0x0) {
    work->info->status_polish = -1;
    csc_spfree(work->pol->Ared);
LAB_00106fbb:
    free(a);
    return -1;
  }
  (*plsh->solve)(plsh,a_00);
  pOVar13 = work->pol;
  lVar14 = work->settings->polish_refine_iter;
  if (0 < lVar14) {
    local_38 = plsh;
    lVar17 = pOVar13->Ared->m + work->data->n;
    b = (c_float *)malloc(lVar17 * 8);
    if (b == (c_float *)0x0) {
      cVar11 = _osqp_error(OSQP_MEM_ALLOC_ERROR,"iterative_refinement");
      pOVar13 = work->pol;
      if (cVar11 != 0) {
        work->info->status_polish = -1;
        csc_spfree(pOVar13->Ared);
        free(a);
        a = a_00;
        goto LAB_00106fbb;
      }
    }
    else {
      lVar12 = 0;
      lVar16 = 0;
      local_40 = lVar17;
      if (0 < lVar17) {
        lVar16 = lVar17;
      }
      for (; lVar12 < lVar14; lVar12 = lVar12 + 1) {
        prea_vec_copy(a,b,local_40);
        mat_vec(work->data->P,a_00,b,-1);
        mat_tpose_vec(work->data->P,a_00,b,-1,1);
        mat_tpose_vec(work->pol->Ared,a_00 + work->data->n,b,-1,0);
        mat_vec(work->pol->Ared,a_00,b + work->data->n,-1);
        (*local_38->solve)(local_38,b);
        for (lVar14 = 0; lVar16 != lVar14; lVar14 = lVar14 + 1) {
          a_00[lVar14] = b[lVar14] + a_00[lVar14];
        }
        lVar14 = work->settings->polish_refine_iter;
      }
      free(b);
      pOVar13 = work->pol;
    }
  }
  prea_vec_copy(a_00,pOVar13->x,work->data->n);
  mat_vec(work->data->A,work->pol->x,work->pol->z,0);
  pOVar10 = work->data;
  pOVar13 = work->pol;
  lVar14 = pOVar13->n_low;
  if (pOVar13->n_upp + lVar14 == 0) {
    vec_set_scalar(pOVar13->y,0.0,pOVar10->m);
    pOVar13 = work->pol;
  }
  else {
    lVar17 = pOVar10->n;
    lVar12 = 0;
    lVar16 = pOVar10->m;
    if (pOVar10->m < 1) {
      lVar16 = lVar12;
    }
    for (; lVar16 != lVar12; lVar12 = lVar12 + 1) {
      lVar15 = pOVar13->A_to_Alow[lVar12];
      if (lVar15 == -1) {
        if (pOVar13->A_to_Aupp[lVar12] != -1) {
          lVar15 = lVar14 + pOVar13->A_to_Aupp[lVar12];
          goto LAB_00107163;
        }
        cVar18 = 0.0;
      }
      else {
LAB_00107163:
        cVar18 = a_00[lVar17 + lVar15];
      }
      pOVar13->y[lVar12] = cVar18;
    }
  }
  project_normalcone(work,pOVar13->z,pOVar13->y);
  update_info(work,0,1,1);
  pOVar13 = work->pol;
  pOVar6 = work->info;
  dVar2 = pOVar6->dua_res;
  dVar7 = pOVar13->pri_res;
  dVar8 = pOVar13->dua_res;
  if (((dVar7 < pOVar6->pri_res) && ((dVar8 < dVar2 || (dVar2 < 1e-10)))) ||
     ((pOVar6->pri_res < 1e-10 && (dVar8 < dVar2)))) {
    pOVar6->obj_val = pOVar13->obj_val;
    pOVar6->pri_res = dVar7;
    pOVar6->dua_res = dVar8;
    pOVar6->status_polish = 1;
    prea_vec_copy(pOVar13->x,work->x,work->data->n);
    prea_vec_copy(work->pol->z,work->z,work->data->m);
    prea_vec_copy(work->pol->y,work->y,work->data->m);
    if (work->settings->verbose != 0) {
      print_polish(work);
    }
  }
  else {
    pOVar6->status_polish = -1;
  }
  (*plsh->free)(plsh);
  csc_spfree(work->pol->Ared);
  free(a);
  free(a_00);
  return 0;
}

Assistant:

c_int polish(OSQPWorkspace *work) {
  c_int mred, polish_successful, exitflag;
  c_float *rhs_red;
  LinSysSolver *plsh;
  c_float *pol_sol; // Polished solution

#ifdef PROFILING
  osqp_tic(work->timer); // Start timer
#endif /* ifdef PROFILING */

  // Form Ared by assuming the active constraints and store in work->pol->Ared
  mred = form_Ared(work);
  if (mred < 0) { // work->pol->red = OSQP_NULL
    // Polishing failed
    work->info->status_polish = -1;

    return -1;
  }

  // Form and factorize reduced KKT
  exitflag = init_linsys_solver(&plsh, work->data->P, work->pol->Ared,
                                work->settings->delta, OSQP_NULL,
                                work->settings->linsys_solver, 1);

  if (exitflag) {
    // Polishing failed
    work->info->status_polish = -1;

    // Memory clean-up
    if (work->pol->Ared) csc_spfree(work->pol->Ared);

    return 1;
  }

  // Form reduced right-hand side rhs_red
  rhs_red = c_malloc(sizeof(c_float) * (work->data->n + mred));
  if (!rhs_red) {
    // Polishing failed
    work->info->status_polish = -1;

    // Memory clean-up
    csc_spfree(work->pol->Ared);

    return -1;
  }
  form_rhs_red(work, rhs_red);

  pol_sol = vec_copy(rhs_red, work->data->n + mred);
  if (!pol_sol) {
    // Polishing failed
    work->info->status_polish = -1;

    // Memory clean-up
    csc_spfree(work->pol->Ared);
    c_free(rhs_red);
  
    return -1;
  }

  // Solve the reduced KKT system
  plsh->solve(plsh, pol_sol);

  // Perform iterative refinement to compensate for the regularization error
  exitflag = iterative_refinement(work, plsh, pol_sol, rhs_red);

  if (exitflag) {
    // Polishing failed
    work->info->status_polish = -1;

    // Memory clean-up
    csc_spfree(work->pol->Ared);
    c_free(rhs_red);
    c_free(pol_sol);
  
    return -1;
  }

  // Store the polished solution (x,z,y)
  prea_vec_copy(pol_sol, work->pol->x, work->data->n);   // pol->x
  mat_vec(work->data->A, work->pol->x, work->pol->z, 0); // pol->z
  get_ypol_from_yred(work, pol_sol + work->data->n);     // pol->y

  // Ensure (z,y) satisfies normal cone constraint
  project_normalcone(work, work->pol->z, work->pol->y);

  // Compute primal and dual residuals at the polished solution
  update_info(work, 0, 1, 1);

  // Check if polish was successful
  polish_successful = (work->pol->pri_res < work->info->pri_res &&
                       work->pol->dua_res < work->info->dua_res) || // Residuals
                                                                    // are
                                                                    // reduced
                      (work->pol->pri_res < work->info->pri_res &&
                       work->info->dua_res < 1e-10) ||              // Dual
                                                                    // residual
                                                                    // already
                                                                    // tiny
                      (work->pol->dua_res < work->info->dua_res &&
                       work->info->pri_res < 1e-10);                // Primal
                                                                    // residual
                                                                    // already
                                                                    // tiny

  if (polish_successful) {
    // Update solver information
    work->info->obj_val       = work->pol->obj_val;
    work->info->pri_res       = work->pol->pri_res;
    work->info->dua_res       = work->pol->dua_res;
    work->info->status_polish = 1;

    // Update (x, z, y) in ADMM iterations
    // NB: z needed for warm starting
    prea_vec_copy(work->pol->x, work->x, work->data->n);
    prea_vec_copy(work->pol->z, work->z, work->data->m);
    prea_vec_copy(work->pol->y, work->y, work->data->m);

    // Print summary
#ifdef PRINTING

    if (work->settings->verbose) print_polish(work);
#endif /* ifdef PRINTING */
  } else { // Polishing failed
    work->info->status_polish = -1;

    // TODO: Try to find a better solution on the line connecting ADMM
    //       and polished solution
  }

  // Memory clean-up
  plsh->free(plsh);

  // Checks that they are not NULL are already performed earlier
  csc_spfree(work->pol->Ared);
  c_free(rhs_red);
  c_free(pol_sol);

  return 0;
}